

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::LoadUserDict(DictTrie *this,string *filePaths)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  ostream *poVar5;
  Logger *this_00;
  reference pvVar6;
  istream *piVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string line;
  ifstream ifs;
  size_t i;
  size_t lineno;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostream *in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  char *in_stack_fffffffffffffbc8;
  ulong uVar9;
  string local_418 [52];
  int in_stack_fffffffffffffc1c;
  char *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  Logger *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffd18;
  DictTrie *in_stack_fffffffffffffd20;
  istream local_278 [520];
  ulong local_70;
  long local_68;
  allocator<char> local_49;
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_stack_fffffffffffffbc8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
  limonp::Split(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68 = 0;
  local_70 = 0;
  while (uVar9 = local_70,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_28), uVar9 < sVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,local_70);
    uVar4 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_278,uVar4,8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      limonp::Logger::Logger
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc1c);
      poVar5 = limonp::Logger::Stream((Logger *)(local_418 + 0x20));
      poVar5 = std::operator<<(poVar5,"exp: [ifs.is_open()");
      this_00 = (Logger *)std::operator<<(poVar5,"] false. ");
      poVar5 = std::operator<<((ostream *)this_00,"open ");
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_28,local_70);
      in_stack_fffffffffffffba0 = std::operator<<(poVar5,(string *)pvVar6);
      std::operator<<(in_stack_fffffffffffffba0," failed");
      limonp::Logger::~Logger(this_00);
    }
    std::__cxx11::string::string(local_418);
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_278,local_418);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (!bVar2) break;
      lVar8 = std::__cxx11::string::size();
      if (lVar8 != 0) {
        InserUserDictNode(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      local_68 = local_68 + 1;
    }
    std::__cxx11::string::~string(local_418);
    std::ifstream::~ifstream(local_278);
    local_70 = local_70 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffba0);
  return;
}

Assistant:

void LoadUserDict(const string& filePaths) {
    vector<string> files = limonp::Split(filePaths, "|;");
    size_t lineno = 0;
    for (size_t i = 0; i < files.size(); i++) {
      ifstream ifs(files[i].c_str());
      XCHECK(ifs.is_open()) << "open " << files[i] << " failed"; 
      string line;
      
      for (; getline(ifs, line); lineno++) {
        if (line.size() == 0) {
          continue;
        }
        InserUserDictNode(line);
      }
    }
  }